

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

double __thiscall TPZSkylMatrix<double>::GetVal(TPZSkylMatrix<double> *this,int64_t r,int64_t c)

{
  long lVar1;
  int64_t iVar2;
  double **ppdVar3;
  TPZSkylMatrix<double> *this_00;
  long in_RDX;
  long in_RSI;
  int64_t in_RDI;
  int64_t index;
  int64_t index_1;
  int64_t col;
  int64_t row;
  TPZSkylMatrix<double> *in_stack_ffffffffffffffc0;
  TPZSkylMatrix<double> *pTVar4;
  long local_30;
  long local_28 [4];
  double local_8;
  
  local_30 = in_RDX;
  if (in_RDX < in_RSI) {
    local_28[0] = in_RSI;
    TPZMatrix<double>::Swap(local_28,&local_30);
    lVar1 = local_30 - local_28[0];
    iVar2 = Size(in_stack_ffffffffffffffc0,in_RDI);
    if (lVar1 < iVar2) {
      ppdVar3 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),local_30);
      local_8 = (*ppdVar3)[lVar1];
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    this_00 = (TPZSkylMatrix<double> *)(in_RDX - in_RSI);
    pTVar4 = this_00;
    iVar2 = Size(this_00,in_RDI);
    if ((long)this_00 < iVar2) {
      ppdVar3 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 0x20),local_30);
      local_8 = (*ppdVar3)[(long)pTVar4];
    }
    else {
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

const TVar
TPZSkylMatrix<TVar>::GetVal(const int64_t r,const int64_t c ) const
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col ){
		this->Swap( &row, &col );
        const int64_t index   = col - row;
        if ( index < Size(col) ){
            if constexpr (is_complex<TVar>::value){
                return( std::conj(fElem[col][index]) );
            }else{
                return( fElem[col][index] );
            }
        }else{
            return (TVar)0;
        }
    }
	const int64_t index   = col - row;
	if ( index < Size(col) )
		return( fElem[col][index] );
	else {
		return (TVar) 0;
    }

}